

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
Catch::Detail::makeEnumInfo
          (StringRef enumName,StringRef allValueNames,vector<int,_std::allocator<int>_> *values)

{
  size_type __n;
  bool bVar1;
  pointer pEVar2;
  int *__args;
  int *piVar3;
  undefined8 in_RCX;
  size_type in_RDX;
  char *in_RSI;
  _Head_base<0UL,_Catch::Detail::EnumInfo_*,_false> in_RDI;
  undefined8 in_R8;
  vector<int,_std::allocator<int>_> *in_R9;
  StringRef in_stack_00000000;
  int value;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  size_t i;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> valueNames;
  unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_> *enumInfo;
  pointer in_stack_ffffffffffffff28;
  EnumInfo *in_stack_ffffffffffffff30;
  vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
  *__n_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  vector<int,_std::allocator<int>_> *local_88;
  size_type local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> local_60;
  byte local_31;
  vector<int,_std::allocator<int>_> *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  char *local_18;
  size_type sStack_10;
  
  local_31 = 0;
  local_30 = in_R9;
  local_28 = in_RCX;
  uStack_20 = in_R8;
  local_18 = in_RSI;
  sStack_10 = in_RDX;
  operator_new(0x28);
  EnumInfo::EnumInfo(in_stack_ffffffffffffff30);
  std::unique_ptr<Catch::Detail::EnumInfo,std::default_delete<Catch::Detail::EnumInfo>>::
  unique_ptr<std::default_delete<Catch::Detail::EnumInfo>,void>
            ((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_> *)
             in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pEVar2 = clara::std::
           unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>::
           operator->((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                       *)0x27c78c);
  (pEVar2->m_name).m_start = local_18;
  (pEVar2->m_name).m_size = sStack_10;
  pEVar2 = clara::std::
           unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>::
           operator->((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                       *)0x27c7a1);
  __n_00 = &pEVar2->m_values;
  clara::std::vector<int,_std::allocator<int>_>::size(local_30);
  clara::std::
  vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>::
  reserve((vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
           *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),(size_type)__n_00);
  local_78 = local_28;
  uStack_70 = uStack_20;
  parseEnums(in_stack_00000000);
  __args = (int *)clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::size
                            (&local_60);
  piVar3 = (int *)clara::std::vector<int,_std::allocator<int>_>::size(local_30);
  if (__args == piVar3) {
    local_80 = 0;
    local_88 = local_30;
    local_90._M_current =
         (int *)clara::std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
    clara::std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff30,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff28);
      if (!bVar1) break;
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_90);
      pEVar2 = clara::std::
               unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>::
               operator->((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                           *)0x27c8af);
      __n = local_80;
      in_stack_ffffffffffffff30 = (EnumInfo *)&pEVar2->m_values;
      local_80 = local_80 + 1;
      clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::operator[]
                (&local_60,__n);
      std::vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>::
      emplace_back<int&,Catch::StringRef_const&>
                ((vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
                  *)in_RDI._M_head_impl,__args,&in_stack_ffffffffffffff30->m_name);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_90);
    }
    local_31 = 1;
    clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::~vector
              ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)in_RDI._M_head_impl);
    if ((local_31 & 1) == 0) {
      clara::std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
      ::~unique_ptr((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                     *)in_stack_ffffffffffffff30);
    }
    return (unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>)
           in_RDI._M_head_impl;
  }
  __assert_fail("valueNames.size() == values.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/catch.hpp"
                ,0x2984,
                "std::unique_ptr<EnumInfo> Catch::Detail::makeEnumInfo(StringRef, StringRef, const std::vector<int> &)"
               );
}

Assistant:

std::unique_ptr<EnumInfo> makeEnumInfo( StringRef enumName, StringRef allValueNames, std::vector<int> const& values ) {
            std::unique_ptr<EnumInfo> enumInfo( new EnumInfo );
            enumInfo->m_name = enumName;
            enumInfo->m_values.reserve( values.size() );

            const auto valueNames = Catch::Detail::parseEnums( allValueNames );
            assert( valueNames.size() == values.size() );
            std::size_t i = 0;
            for( auto value : values )
                enumInfo->m_values.emplace_back(value, valueNames[i++]);

            return enumInfo;
        }